

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc_re.c
# Opt level: O0

int alloc_re(char **x,uint m,uint n)

{
  char *to;
  char *y;
  uint n_local;
  uint m_local;
  char **x_local;
  
  to = alloc(n);
  if (to != (char *)0x0) {
    byte_copy(to,m,*x);
    alloc_free(*x);
    *x = to;
  }
  x_local._4_4_ = (uint)(to != (char *)0x0);
  return x_local._4_4_;
}

Assistant:

int alloc_re(x,m,n)
char **x;
unsigned int m;
unsigned int n;
{
  char *y;
 
  y = alloc(n);
  if (!y) return 0;
  byte_copy(y,m,*x);
  alloc_free(*x);
  *x = y;
  return 1;
}